

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listOutput.cpp
# Opt level: O0

void __thiscall listOutput::takeValue(listOutput *this)

{
  outputArrow *poVar1;
  WINDOW *pWVar2;
  int iVar3;
  undefined8 uVar4;
  reference pvVar5;
  string local_38 [36];
  int local_14;
  listOutput *plStack_10;
  int val;
  listOutput *this_local;
  
  poVar1 = (this->super_output).outArr;
  plStack_10 = this;
  iVar3 = (*(poVar1->super_arrowType)._vptr_arrowType[2])(poVar1,0xfffffffe);
  local_14 = (int)(short)iVar3;
  pWVar2 = this->outWin;
  iVar3 = this->current;
  makeThreeDigit_abi_cxx11_((int)local_38);
  uVar4 = std::__cxx11::string::c_str();
  mvwprintw(pWVar2,iVar3 + 1,1,"%s",uVar4);
  std::__cxx11::string::~string(local_38);
  wrefresh(this->outWin);
  iVar3 = local_14;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->numStorage,(long)this->current)
  ;
  if (iVar3 != *pvVar5) {
    drawFalse(this);
  }
  return;
}

Assistant:

void listOutput::takeValue() {
	int val = outArr->nodeGet(OUTPUT_ID);
	mvwprintw(outWin, current + 1, 1, "%s", makeThreeDigit(val).c_str());
	wrefresh(outWin);

	if (val != numStorage[current])
		drawFalse();

	return;
}